

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O0

void __thiscall glslang::TIntermBranch::traverse(TIntermBranch *this,TIntermTraverser *it)

{
  int iVar1;
  byte local_19;
  bool visit;
  TIntermTraverser *it_local;
  TIntermBranch *this_local;
  
  local_19 = 1;
  if ((it->preVisit & 1U) != 0) {
    iVar1 = (*it->_vptr_TIntermTraverser[9])(it,0,this);
    local_19 = (byte)iVar1 & 1;
  }
  if ((local_19 != 0) && (this->expression != (TIntermTyped *)0x0)) {
    TIntermTraverser::incrementDepth(it,&this->super_TIntermNode);
    (*(this->expression->super_TIntermNode)._vptr_TIntermNode[2])(this->expression,it);
    TIntermTraverser::decrementDepth(it);
  }
  if ((local_19 != 0) && ((it->postVisit & 1U) != 0)) {
    (*it->_vptr_TIntermTraverser[9])(it,2,this);
  }
  return;
}

Assistant:

void TIntermBranch::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitBranch(EvPreVisit, this);

    if (visit && expression) {
        it->incrementDepth(this);
        expression->traverse(it);
        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitBranch(EvPostVisit, this);
}